

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O2

bool __thiscall
NoMeEdgeCalculator::edgeBetween
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,int numGCAllowedPos,
          int ct)

{
  bool bVar1;
  long lVar2;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = AlignmentRecord::isStrand1(ap1);
  if (((bVar1) && (bVar1 = AlignmentRecord::isStrand1(ap2), !bVar1)) ||
     ((bVar1 = AlignmentRecord::isStrand1(ap1), !bVar1 &&
      (bVar1 = AlignmentRecord::isStrand1(ap2), bVar1)))) {
    return false;
  }
  AlignmentRecord::getName_abi_cxx11_(&local_b0,ap1);
  lVar2 = std::__cxx11::string::find((char *)&local_b0,0x1ae81e);
  bVar1 = true;
  if (lVar2 == -1) {
    AlignmentRecord::getName_abi_cxx11_(&local_90,ap2);
    lVar2 = std::__cxx11::string::find((char *)&local_90,0x1ae81e);
    bVar1 = lVar2 != -1;
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  AlignmentRecord::getCode1_abi_cxx11_(&local_b0,ap1);
  lVar2 = std::__cxx11::string::find((char *)&local_b0,0x1b0510);
  if (lVar2 == -1) {
    AlignmentRecord::getCode1_abi_cxx11_(&local_90,ap1);
    lVar2 = std::__cxx11::string::find((char *)&local_90,0x1b050d);
    if (lVar2 != -1) {
LAB_0017b56d:
      std::__cxx11::string::~string((string *)&local_90);
      goto LAB_0017b577;
    }
    AlignmentRecord::getCode2_abi_cxx11_(&local_70,ap1);
    lVar2 = std::__cxx11::string::find((char *)&local_70,0x1b0510);
    if (lVar2 != -1) {
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_0017b56d;
    }
    AlignmentRecord::getCode2_abi_cxx11_(&local_50,ap1);
    lVar2 = std::__cxx11::string::find((char *)&local_50,0x1b050d);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    if (lVar2 == -1) {
      return false;
    }
  }
  else {
LAB_0017b577:
    std::__cxx11::string::~string((string *)&local_b0);
  }
  AlignmentRecord::getCode1_abi_cxx11_(&local_b0,ap2);
  lVar2 = std::__cxx11::string::find((char *)&local_b0,0x1b0510);
  if (lVar2 == -1) {
    AlignmentRecord::getCode1_abi_cxx11_(&local_90,ap2);
    lVar2 = std::__cxx11::string::find((char *)&local_90,0x1b050d);
    if (lVar2 == -1) {
      AlignmentRecord::getCode2_abi_cxx11_(&local_70,ap2);
      lVar2 = std::__cxx11::string::find((char *)&local_70,0x1b0510);
      if (lVar2 == -1) {
        AlignmentRecord::getCode2_abi_cxx11_(&local_50,ap2);
        lVar2 = std::__cxx11::string::find((char *)&local_50,0x1b050d);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        if (lVar2 == -1) {
          return false;
        }
        goto LAB_0017b616;
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_b0);
LAB_0017b616:
  bVar1 = scoreReads(this,ap1,ap2,bVar1,numGCAllowedPos,ct);
  return bVar1;
}

Assistant:

bool NoMeEdgeCalculator::edgeBetween(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int numGCAllowedPos, int ct) const{
    if (ap1.isStrand1()&& !ap2.isStrand1()) {
        return false;
    }else if (!ap1.isStrand1()&& ap2.isStrand1()) {
        return false;
    }
    bool isClique = false;
    if((ap1.getName().find("Clique")!=std::string::npos)||(ap2.getName().find("Clique")!=std::string::npos)){
        isClique = true;
    }


      //For Ideal Graph. Assumes that the reads have chroma1 or chroma2 written in their names
//    if((ap1.getName().find("chroma1") != std::string::npos && ap2.getName().find("chroma1") != std::string::npos) || (ap1.getName().find("chroma2") != std::string::npos && ap2.getName().find("chroma2") != std::string::npos)){
//        if(((ap1.getCode1().find("C") != std::string::npos) || (ap1.getCode1().find("O") != std::string::npos)) || ((ap1.getCode2().find("C") != std::string::npos) || (ap1.getCode2().find("O") != std::string::npos))){
//            if(((ap2.getCode1().find("C") != std::string::npos) || (ap2.getCode1().find("O") != std::string::npos)) || ((ap2.getCode2().find("C") != std::string::npos) || (ap2.getCode2().find("O") != std::string::npos))){
//                if(scoreReads(ap1,ap2, isClique,numGCAllowedPos,ct)){
//                    return true;
//                }else{
//                    return false;
//                }
//            }else{
//                return false;
//            }
//        }else{
//            return false;
//        }
//    }else{
//        return false;
//    }

    //For normal edge criterion
    if(((ap1.getCode1().find("C") != std::string::npos) || (ap1.getCode1().find("O") != std::string::npos)) || ((ap1.getCode2().find("C") != std::string::npos) || (ap1.getCode2().find("O") != std::string::npos))){
        if(((ap2.getCode1().find("C") != std::string::npos) || (ap2.getCode1().find("O") != std::string::npos)) || ((ap2.getCode2().find("C") != std::string::npos) || (ap2.getCode2().find("O") != std::string::npos))){
            if(scoreReads(ap1,ap2, isClique,numGCAllowedPos,ct)){
                return true;
            }else{
                return false;
            }
        }else{
            return false;
        }
    }else{
        return false;
    }
}